

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode
JsObjectSetProperty(JsValueRef object,JsValueRef propertyId,JsValueRef value,bool useStrictRules)

{
  anon_class_32_4_8a83ee98 fn;
  JsErrorCode JVar1;
  undefined1 local_21;
  JsValueRef pvStack_20;
  bool useStrictRules_local;
  JsValueRef value_local;
  JsValueRef propertyId_local;
  JsValueRef object_local;
  
  fn.propertyId = &stack0xffffffffffffffe0;
  fn.object = &value_local;
  fn.value = (JsValueRef *)&local_21;
  fn.useStrictRules = (bool *)&propertyId_local;
  local_21 = useStrictRules;
  pvStack_20 = value;
  value_local = propertyId;
  propertyId_local = object;
  JVar1 = ContextAPIWrapper<false,JsObjectSetProperty::__0>(fn);
  return JVar1;
}

Assistant:

CHAKRA_API JsObjectSetProperty(_In_ JsValueRef object, _In_ JsValueRef propertyId, _In_ JsValueRef value, _In_ bool useStrictRules)
{
    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&] (Js::ScriptContext *scriptContext,
        TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION_NOT_IMPLEMENTED(scriptContext);

        VALIDATE_INCOMING_OBJECT(object, scriptContext);
        VALIDATE_INCOMING_RECYCLABLE(propertyId, scriptContext);
        VALIDATE_INCOMING_REFERENCE(value, scriptContext);

        const Js::PropertyRecord *propertyRecord = nullptr;
        JsErrorCode errorValue = InternalGetPropertyRecord(scriptContext,
            Js::VarTo<Js::RecyclableObject>(propertyId), &propertyRecord);

        if (errorValue != JsNoError)
        {
            return errorValue;
        }

        Assert(propertyRecord != nullptr);

        return JsSetPropertyCommon(scriptContext, object, propertyRecord, value, useStrictRules);
    });
}